

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcObjectDefinition::~IfcObjectDefinition(IfcObjectDefinition *this)

{
  ~IfcObjectDefinition((IfcObjectDefinition *)&this[-1].super_IfcRoot.field_0x28);
  return;
}

Assistant:

IfcObjectDefinition() : Object("IfcObjectDefinition") {}